

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall
Engine::Engine(Engine *this,string *prefix,
              unique_ptr<Handler,_std::default_delete<Handler>_> *handler)

{
  std::__cxx11::string::string((string *)this,(string *)prefix);
  (this->handlers).
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->handlers).
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->handlers).
  super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
  ::emplace_back<std::unique_ptr<Handler,std::default_delete<Handler>>>
            ((vector<std::unique_ptr<Handler,std::default_delete<Handler>>,std::allocator<std::unique_ptr<Handler,std::default_delete<Handler>>>>
              *)&this->handlers,handler);
  return;
}

Assistant:

Engine::Engine(std::string prefix, std::unique_ptr<Handler> handler) : prefix(std::move(prefix)) {
    handlers.push_back(std::move(handler));
}